

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

SizedPtr google::protobuf::internal::anon_unknown_12::AllocateCleanupChunk
                   (AllocationPolicy *policy_ptr,size_t last_size)

{
  size_t size_00;
  size_t size;
  size_t kMaxSize;
  size_t kStartSize;
  size_t last_size_local;
  AllocationPolicy *policy_ptr_local;
  
  size_00 = AllocationSize(last_size,0x40,0x1000);
  if (policy_ptr == (AllocationPolicy *)0x0) {
    _policy_ptr_local = AllocateAtLeast(size_00);
  }
  else {
    _policy_ptr_local = AllocateMemory(policy_ptr,size_00);
  }
  return _policy_ptr_local;
}

Assistant:

SizedPtr AllocateCleanupChunk(const AllocationPolicy* policy_ptr,
                              size_t last_size) {
  constexpr size_t kStartSize = 64;
  constexpr size_t kMaxSize = 4 << 10;
  static_assert(kStartSize % sizeof(cleanup::CleanupNode) == 0, "");

  const size_t size = AllocationSize(last_size, kStartSize, kMaxSize);
  if (policy_ptr == nullptr) return AllocateAtLeast(size);
  return AllocateMemory(*policy_ptr, size);
}